

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

StringOrCallback * __thiscall
google::protobuf::io::Printer::ValueImpl<true>::
ToStringOrCallback<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__11,void>
          (variant<std::__cxx11::string,std::function<bool()>> *__return_storage_ptr__,
          ValueImpl<true> *this,void *cb)

{
  anon_class_48_2_5060b9fc local_78;
  function<bool_()> local_48;
  void *local_28;
  anon_class_40_5_84860369_for_cb *cb_local;
  ValueImpl<true> *this_local;
  variant<std::__cxx11::string,std::function<bool()>> *local_10;
  
  local_28 = cb;
  cb_local = (anon_class_40_5_84860369_for_cb *)this;
  local_10 = __return_storage_ptr__;
  memcpy(&local_78,cb,0x28);
  local_78.is_called = false;
  std::function<bool()>::
  function<google::protobuf::io::Printer::ValueImpl<true>::ToStringOrCallback<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__11,void>(google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__11&&,google::protobuf::io::Printer::ValueImpl<true>::Rank2)::_lambda()_1_,void>
            ((function<bool()> *)&local_48,&local_78);
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (__return_storage_ptr__,&local_48);
  std::function<bool_()>::~function(&local_48);
  return (StringOrCallback *)__return_storage_ptr__;
}

Assistant:

auto Printer::ValueImpl<owned>::ToStringOrCallback(Cb&& cb, Rank2)
    -> StringOrCallback {
  return Callback(
      [cb = std::forward<Cb>(cb), is_called = false]() mutable -> bool {
        if (is_called) {
          // Catch whether or not this function is being called recursively.
          return false;
        }
        is_called = true;
        cb();
        is_called = false;
        return true;
      });
}